

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_detail.h
# Opt level: O0

void boost::spirit::traits::
     assign_to_attribute_from_value<lf::io::GMshFileV4::ElementType,_int,_void>::call
               (int *raw,ElementType *cat)

{
  ElementType *cat_local;
  int *raw_local;
  
  *cat = *raw;
  return;
}

Assistant:

static void call(RawValue const& raw, Enum& cat) {
    if constexpr (detail::has_value_type<RawValue>::value) {  // NOLINT
      // specialization for endian::endian
      const typename RawValue::value_type value = raw;
      cat = static_cast<Enum>(value);
    } else {  // NOLINT
      cat = static_cast<Enum>(raw);
    }
  }